

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidConvolution3DNoBias(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *this_00;
  uint uVar1;
  Rep *pRVar2;
  ulong uVar3;
  bool bVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetworkLayer *pNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  void *pvVar11;
  LayerUnion LVar12;
  WeightParams *pWVar13;
  float *pfVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar18;
  uint uVar19;
  int iVar20;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar2 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0016bb60:
    pRVar17 = &(local_80.description_)->input_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar20 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0016bb60;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar11 = pRVar2->elements[iVar20];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"input",puVar16);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar1 = (pAVar8->shape_).current_size_;
  if (uVar1 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar1] = 1;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar1] = 1;
  }
  uVar19 = uVar1 + 1;
  (pAVar8->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 2);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 3;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 3;
  }
  uVar19 = uVar1 + 2;
  (pAVar8->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 3);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 0x20;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 0x20;
  }
  uVar19 = uVar1 + 3;
  (pAVar8->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 4);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 100;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 100;
  }
  uVar19 = uVar1 + 4;
  (pAVar8->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 5);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 100;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 100;
  }
  this->current_size_ = uVar1 + 5;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar2 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0016bdac:
    pRVar17 = &(local_80.description_)->output_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar20 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0016bdac;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar11 = pRVar2->elements[iVar20];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"probs",puVar16);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar18);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar2 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0016bead:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar9 = (NeuralNetworkLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       ((RepeatedPtrFieldBase *)this_01,pNVar9);
  }
  else {
    iVar20 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0016bead;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar20 + 1;
    pNVar9 = (NeuralNetworkLayer *)pRVar2->elements[iVar20];
  }
  pRVar2 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0016bee5:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar9->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar9->input_).super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar20 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0016bee5;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar11 = pRVar2->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3a8ef3);
  pRVar2 = (pNVar9->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar20 = (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar20 < pRVar2->allocated_size) {
      (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
      pvVar11 = pRVar2->elements[iVar20];
      goto LAB_0016bf4f;
    }
  }
  pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar9->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar9->output_).super_RepeatedPtrFieldBase,pbVar10);
LAB_0016bf4f:
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3977ad);
  if (pNVar9->_oneof_case_[0] == 0x5bf) {
    LVar12 = pNVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar9);
    pNVar9->_oneof_case_[0] = 0x5bf;
    uVar3 = (pNVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    LVar12.convolution3d_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(pAVar18);
    (pNVar9->layer_).convolution3d_ = (Convolution3DLayerParams *)LVar12;
  }
  (LVar12.gru_)->outputgateweightmatrix_ = (WeightParams *)0x300000003;
  (LVar12.scale_)->scale_ = (WeightParams *)0x300000001;
  (LVar12.scale_)->bias_ = (WeightParams *)0x300000003;
  (LVar12.gru_)->outputgaterecursionmatrix_ = (WeightParams *)0x100000001;
  (LVar12.gru_)->updategatebiasvector_ = (WeightParams *)0x100000001;
  (LVar12.gru_)->resetgatebiasvector_ = (WeightParams *)0x100000001;
  *(undefined8 *)((long)&(LVar12.gru_)->outputgatebiasvector_ + 4) = 0;
  *(undefined8 *)((long)&(LVar12.convolution_)->weights_ + 4) = 0;
  (LVar12.convolution_)->bias_ = (WeightParams *)0x0;
  (LVar12.convolution_)->outputchannels_ = 0;
  (LVar12.convolution3d_)->hasbias_ = true;
  iVar20 = 0xf3;
  do {
    pWVar13 = (LVar12.batchnorm_)->variance_;
    if (pWVar13 == (WeightParams *)0x0) {
      uVar3 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar18 = *(Arena **)pAVar18;
      }
      pWVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar18);
      (LVar12.batchnorm_)->variance_ = pWVar13;
    }
    this_00 = &pWVar13->floatvalue_;
    uVar1 = (pWVar13->floatvalue_).current_size_;
    if (uVar1 == (pWVar13->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(this_00,uVar1 + 1);
      pfVar14 = google::protobuf::RepeatedField<float>::elements(this_00);
      pfVar14[uVar1] = 1.0;
    }
    else {
      pfVar14 = google::protobuf::RepeatedField<float>::elements(this_00);
      pfVar14[uVar1] = 1.0;
    }
    this_00->current_size_ = uVar1 + 1;
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar4 = CoreML::Result::good(&local_50);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)bVar4;
}

Assistant:

int testInvalidConvolution3DNoBias() {

    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);

    params->set_hasbias(true);

    // Fill Weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying any biases should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}